

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::ApplyMasterScale(Discreet3DSImporter *this,aiScene *pScene)

{
  aiMatrix4x4t<float> local_58;
  aiScene *local_18;
  aiScene *pScene_local;
  Discreet3DSImporter *this_local;
  
  if ((this->mMasterScale != 0.0) || (NAN(this->mMasterScale))) {
    this->mMasterScale = 1.0 / this->mMasterScale;
  }
  else {
    this->mMasterScale = 1.0;
  }
  local_18 = pScene;
  pScene_local = (aiScene *)this;
  aiMatrix4x4t<float>::aiMatrix4x4t
            (&local_58,this->mMasterScale,0.0,0.0,0.0,0.0,this->mMasterScale,0.0,0.0,0.0,0.0,
             this->mMasterScale,0.0,0.0,0.0,0.0,1.0);
  aiMatrix4x4t<float>::operator*=(&local_18->mRootNode->mTransformation,&local_58);
  return;
}

Assistant:

void Discreet3DSImporter::ApplyMasterScale(aiScene* pScene)
{
    // There are some 3DS files with a zero scaling factor
    if (!mMasterScale)mMasterScale = 1.0f;
    else mMasterScale = 1.0f / mMasterScale;

    // Construct an uniform scaling matrix and multiply with it
    pScene->mRootNode->mTransformation *= aiMatrix4x4(
        mMasterScale,0.0f, 0.0f, 0.0f,
        0.0f, mMasterScale,0.0f, 0.0f,
        0.0f, 0.0f, mMasterScale,0.0f,
        0.0f, 0.0f, 0.0f, 1.0f);

    // Check whether a scaling track is assigned to the root node.
}